

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O1

bool __thiscall Grid::slime(Grid *this,point p)

{
  cg_box *this_00;
  pointer pcVar1;
  uint *puVar2;
  cg_other *pcVar3;
  cgo_char *d;
  pointer pcVar4;
  byte bVar5;
  bool bVar6;
  
  if ((((p.x < 0) || ((long)p < 0)) || (this_00 = (this->box).ptr, this_00->w <= p.x)) ||
     (this_00->h <= p.y)) {
    pcVar3 = (this->other).ptr;
    pcVar4 = (pcVar3->data).
             super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar1 = (pcVar3->data).
             super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar4 != pcVar1) {
      do {
        bVar6 = pcVar4->p == p;
        pcVar3 = (cg_other *)((ulong)pcVar3 & 0xff);
        if (bVar6) {
          pcVar3 = (cg_other *)(ulong)((pcVar4->ch & this->SLIMEBIT) != 0);
        }
        bVar5 = (byte)pcVar3;
        if (bVar6) goto LAB_0010dadc;
        pcVar4 = pcVar4 + 1;
      } while (pcVar4 != pcVar1);
    }
    bVar5 = 0;
  }
  else {
    puVar2 = (uint *)cg_box::at(this_00,p);
    bVar5 = (*puVar2 & this->SLIMEBIT) != 0;
  }
LAB_0010dadc:
  return (bool)(bVar5 & 1);
}

Assistant:

bool Grid::slime(point p) {
    if (box->contains(p)) return !!(box->at(p) & SLIMEBIT);
    for (auto &d: other->data) {
        if (d.p == p) return !!(d.ch & SLIMEBIT);
    }
    return false;
}